

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::PrintSmartPointer<void_const,std::shared_ptr<void_const>>
               (shared_ptr<const_void> *ptr,ostream *os,char param_3)

{
  long lVar1;
  char *pcVar2;
  
  if ((ptr->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    pcVar2 = "(nullptr)";
    lVar1 = 9;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
    os = std::ostream::_M_insert<void_const*>(os);
    pcVar2 = ")";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, char) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    // We can't print the value. Just print the pointer..
    *os << "(" << (VoidifyPointer)(ptr.get()) << ")";
  }
}